

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O0

void __thiscall
BattleWithLandlord::AlphaBetaDFS
          (BattleWithLandlord *this,BattleWithLandlord *bld,int *score,bool *res)

{
  int iVar1;
  undefined1 *in_RCX;
  int *in_RDX;
  BattleWithLandlord *in_RDI;
  lock_guard<std::mutex> lck;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  
  iVar1 = GetBestMove(in_RDI,in_stack_ffffffffffffffcc);
  *in_RDX = iVar1;
  if ((*in_RDX < 0x7149) && (-0x7149 < *in_RDX)) {
    *in_RCX = 0;
  }
  else {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_RDI,
               (mutex_type *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    in_RDI->_stopsearch = true;
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x122760);
    *in_RCX = 1;
  }
  return;
}

Assistant:

void BattleWithLandlord::AlphaBetaDFS(BattleWithLandlord *bld, int &score, bool &res) {

    score = bld->GetBestMove(128);
    if (score > WIN_SCORE || score < -WIN_SCORE) {
        {
            std::lock_guard<std::mutex> lck(_mtx);
            _stopsearch = true;
        }
        res = true;
    } else {
        res = false;
    }
}